

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  istream *this;
  ostream *this_00;
  long *plVar1;
  mapped_type *pmVar2;
  long lVar3;
  undefined8 *puVar4;
  int i;
  int iVar5;
  undefined1 local_70 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mountains;
  int SX;
  int SY;
  int MH;
  
  SY = 0;
  do {
    this = (istream *)
           std::istream::operator>>
                     ((istream *)&std::cin,
                      (int *)&mountains._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::istream::operator>>
              (this,(int *)((long)&mountains._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    std::istream::ignore();
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mountains;
    mountains._M_t._M_impl._0_4_ = 0;
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    iVar5 = 0;
    mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      std::istream::operator>>((istream *)&std::cin,&SX);
      std::istream::ignore();
      this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,": ",2);
      plVar1 = (long *)std::ostream::operator<<(this_00,SX);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)local_70,&SX);
      *pmVar2 = iVar5;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 8);
    SY = SY & 0xff;
    if (mountains._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 0x18894) {
      SY = 0;
    }
    if ((SY & 1U) == 0) {
      if ((_Rb_tree_node_base *)&mountains !=
          mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Highest mountain is ",0x14);
        lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&mountains);
        plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,*(int *)(lVar3 + 0x24));
        std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
        std::ostream::put((char)plVar1);
        std::ostream::flush();
      }
      if ((_Rb_tree_node_base *)&mountains !=
          mountains._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&mountains);
        if (*(int *)(lVar3 + 0x24) ==
            (int)mountains._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FIRE",4);
          puVar4 = &std::cout;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          SY = (int)CONCAT71((int7)((ulong)puVar4 >> 8),1);
          std::ostream::flush();
          goto LAB_00102520;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HOLD",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HOLD",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
    }
LAB_00102520:
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)local_70);
  } while( true );
}

Assistant:

int main()
{
    int last_sy = 100500;
    // game loop
    bool discharged = false;
    while (1)
    {
        int SX;
        int SY;
        cin >> SX >> SY;
        cin.ignore();

        typedef std::map<int, int> mountains_t;
        std::map<int, int> mountains;
        for (int i = 0; i < 8; i++)
        {
            int MH; // represents the height of one mountain, from 9 to 0. Mountain heights are provided from left to right.
            cin >> MH;
            cin.ignore();
            
            std::cerr << i << ": " << MH << std::endl;
            mountains[MH] = i;
        }
        
        if (last_sy != SY)
        {
            discharged = false;
        }

        if (!discharged)
        {
            mountains_t::const_reverse_iterator m = mountains.rbegin();
            if (m != mountains.rend())
            {
                std::cerr << "Highest mountain is " << m->second << std::endl;
            }
            if (m != mountains.rend() && m->second == SX)
            {
                std::cout << "FIRE" << std::endl;
                discharged = true;
            } else
            {
                std::cout << "HOLD" << std::endl;
            }
        } else
        {
            std::cout << "HOLD" << std::endl;
        }
    }
}